

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O1

void __thiscall NeuralNetwork::gradientDescent(NeuralNetwork *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  pointer pLVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Index size_1;
  long lVar17;
  char *pcVar18;
  Index size;
  Index index_2;
  Index index_1;
  ulong uVar19;
  Index index;
  ulong uVar20;
  long lVar21;
  
  if (1 < this->layerCount_) {
    lVar17 = 0;
    do {
      pLVar7 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = *(Index *)((long)&pLVar7[lVar17].biasGrads.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                 m_storage + 8);
      if ((long)uVar20 < 0) goto LAB_00105a45;
      uVar19 = *(Index *)((long)&pLVar7[lVar17].bias.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                 m_storage + 8);
      if (uVar19 != uVar20) goto LAB_00105a5c;
      fVar6 = this->learningRate_;
      lVar8 = (long)pLVar7[lVar17].biasGrads.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar9 = (long)pLVar7[lVar17].bias.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar20 = uVar19 + 3;
      if (-1 < (long)uVar19) {
        uVar20 = uVar19;
      }
      uVar20 = uVar20 & 0xfffffffffffffffc;
      if (3 < (long)uVar19) {
        lVar21 = 0;
        do {
          pfVar1 = (float *)(lVar8 + lVar21 * 4);
          fVar11 = pfVar1[1];
          fVar12 = pfVar1[2];
          fVar13 = pfVar1[3];
          pfVar2 = (float *)(lVar9 + lVar21 * 4);
          fVar14 = pfVar2[1];
          fVar15 = pfVar2[2];
          fVar16 = pfVar2[3];
          pfVar3 = (float *)(lVar9 + lVar21 * 4);
          *pfVar3 = *pfVar2 - *pfVar1 * fVar6;
          pfVar3[1] = fVar14 - fVar11 * fVar6;
          pfVar3[2] = fVar15 - fVar12 * fVar6;
          pfVar3[3] = fVar16 - fVar13 * fVar6;
          lVar21 = lVar21 + 4;
        } while (lVar21 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar19) {
        do {
          *(float *)(lVar9 + uVar20 * 4) =
               *(float *)(lVar9 + uVar20 * 4) - *(float *)(lVar8 + uVar20 * 4) * fVar6;
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
      }
      uVar20 = *(Index *)((long)&pLVar7[lVar17].weightGrads.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                 m_storage + 8);
      uVar19 = *(Index *)((long)&pLVar7[lVar17].weightGrads.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                 m_storage + 0x10);
      if ((long)(uVar19 | uVar20) < 0) {
        pcVar18 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, -1>]"
        ;
        goto LAB_00105a90;
      }
      uVar10 = *(Index *)((long)&pLVar7[lVar17].weights.
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                 m_storage + 8);
      if ((uVar10 != uVar20) ||
         (uVar20 = *(Index *)((long)&pLVar7[lVar17].weights.
                                     super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                     .m_storage + 0x10), uVar20 != uVar19)) {
        pcVar18 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Matrix<float, -1, -1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
        ;
        goto LAB_00105a71;
      }
      fVar6 = this->learningRate_;
      lVar8 = (long)pLVar7[lVar17].weightGrads.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
      ;
      lVar9 = (long)pLVar7[lVar17].weights.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
      ;
      uVar20 = uVar20 * uVar10;
      uVar19 = uVar20 + 3;
      if (-1 < (long)uVar20) {
        uVar19 = uVar20;
      }
      uVar19 = uVar19 & 0xfffffffffffffffc;
      if (3 < (long)uVar20) {
        lVar21 = 0;
        do {
          pfVar1 = (float *)(lVar8 + lVar21 * 4);
          fVar11 = pfVar1[1];
          fVar12 = pfVar1[2];
          fVar13 = pfVar1[3];
          pfVar2 = (float *)(lVar9 + lVar21 * 4);
          fVar14 = pfVar2[1];
          fVar15 = pfVar2[2];
          fVar16 = pfVar2[3];
          pfVar3 = (float *)(lVar9 + lVar21 * 4);
          *pfVar3 = *pfVar2 - *pfVar1 * fVar6;
          pfVar3[1] = fVar14 - fVar11 * fVar6;
          pfVar3[2] = fVar15 - fVar12 * fVar6;
          pfVar3[3] = fVar16 - fVar13 * fVar6;
          lVar21 = lVar21 + 4;
        } while (lVar21 < (long)uVar19);
      }
      if ((long)uVar19 < (long)uVar20) {
        do {
          *(float *)(lVar9 + uVar19 * 4) =
               *(float *)(lVar9 + uVar19 * 4) - *(float *)(lVar8 + uVar19 * 4) * fVar6;
          uVar19 = uVar19 + 1;
        } while (uVar20 - uVar19 != 0);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (long)this->layerCount_ + -1);
  }
  pLVar7 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar20 = pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (-1 < (long)uVar20) {
    uVar19 = pLVar7[-1].bias.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    if (uVar19 == uVar20) {
      fVar6 = this->learningRate_;
      pfVar1 = pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pfVar2 = pLVar7[-1].bias.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar20 = uVar19 + 3;
      if (-1 < (long)uVar19) {
        uVar20 = uVar19;
      }
      uVar20 = uVar20 & 0xfffffffffffffffc;
      if (3 < (long)uVar19) {
        lVar17 = 0;
        do {
          pfVar3 = pfVar1 + lVar17;
          fVar11 = pfVar3[1];
          fVar12 = pfVar3[2];
          fVar13 = pfVar3[3];
          pfVar4 = pfVar2 + lVar17;
          fVar14 = pfVar4[1];
          fVar15 = pfVar4[2];
          fVar16 = pfVar4[3];
          pfVar5 = pfVar2 + lVar17;
          *pfVar5 = *pfVar4 - *pfVar3 * fVar6;
          pfVar5[1] = fVar14 - fVar11 * fVar6;
          pfVar5[2] = fVar15 - fVar12 * fVar6;
          pfVar5[3] = fVar16 - fVar13 * fVar6;
          lVar17 = lVar17 + 4;
        } while (lVar17 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar19) {
        do {
          pfVar2[uVar20] = pfVar2[uVar20] - pfVar1[uVar20] * fVar6;
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
      }
      return;
    }
LAB_00105a5c:
    pcVar18 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
    ;
LAB_00105a71:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar18);
  }
LAB_00105a45:
  pcVar18 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, 1>]"
  ;
LAB_00105a90:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar18);
}

Assistant:

void NeuralNetwork::gradientDescent() {
    using namespace std;
    //最后一层没有权重
    for (int i = 0; i < layerCount_ - 1; ++i) {
        auto& l = layers_[i];
        l.bias -= l.biasGrads * learningRate_;
        l.weights -= l.weightGrads * learningRate_;
    }
    this->layers_.back().bias -= this->layers_.back().biasGrads * learningRate_;
}